

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *comparator)

{
  long lVar1;
  KeyComparator *in_RSI;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_RDI;
  long in_FS_OFFSET;
  Arena *in_stack_ffffffffffffff98;
  Arena *in_stack_ffffffffffffffd0;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  KeyComparator::KeyComparator
            ((KeyComparator *)in_stack_ffffffffffffff98,(InternalKeyComparator *)0x18a68ac);
  *(undefined4 *)&in_RDI->arena_ = 0;
  Arena::Arena(in_stack_ffffffffffffff98);
  KeyComparator::KeyComparator
            ((KeyComparator *)in_stack_ffffffffffffff98,(KeyComparator *)0x18a68e8);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
            (this_00,in_RSI,in_stack_ffffffffffffffd0);
  KeyComparator::~KeyComparator((KeyComparator *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

MemTable::MemTable(const InternalKeyComparator& comparator)
    : comparator_(comparator), refs_(0), table_(comparator_, &arena_) {}